

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O3

char * wabt::GetSectionName(BinarySection sec)

{
  if ((uint)sec < 0xe) {
    return &DAT_00172560 + *(int *)(&DAT_00172560 + (ulong)(uint)sec * 4);
  }
  abort();
}

Assistant:

const char* GetSectionName(BinarySection sec) {
  switch (sec) {
#define V(Name, name, code) \
  case BinarySection::Name: \
    return #Name;
    WABT_FOREACH_BINARY_SECTION(V)
#undef V
    default:
      WABT_UNREACHABLE;
  }
}